

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O2

Move<vk::Handle<(vk::HandleType)8>_> *
vkt::memory::anon_unknown_0::createBuffer
          (Move<vk::Handle<(vk::HandleType)8>_> *__return_storage_ptr__,DeviceInterface *vkd,
          VkDevice device,VkDeviceSize size,VkBufferUsageFlags usage,VkSharingMode sharingMode,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *queueFamilies)

{
  VkBufferCreateInfo local_40;
  
  local_40.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  local_40.pNext = (void *)0x0;
  local_40.flags = 0;
  local_40.pQueueFamilyIndices =
       (queueFamilies->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_start;
  local_40.queueFamilyIndexCount =
       (deUint32)
       ((ulong)((long)(queueFamilies->
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)local_40.pQueueFamilyIndices) >> 2);
  local_40.size = size;
  local_40.usage = usage;
  local_40.sharingMode = sharingMode;
  ::vk::createBuffer(__return_storage_ptr__,vkd,device,&local_40,(VkAllocationCallbacks *)0x0);
  return __return_storage_ptr__;
}

Assistant:

vk::Move<vk::VkBuffer> createBuffer (const vk::DeviceInterface&	vkd,
									 vk::VkDevice				device,
									 vk::VkDeviceSize			size,
									 vk::VkBufferUsageFlags		usage,
									 vk::VkSharingMode			sharingMode,
									 const vector<deUint32>&	queueFamilies)
{
	const vk::VkBufferCreateInfo	createInfo =
	{
		vk::VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO,
		DE_NULL,

		0,	// flags
		size,
		usage,
		sharingMode,
		(deUint32)queueFamilies.size(),
		&queueFamilies[0]
	};

	return vk::createBuffer(vkd, device, &createInfo);
}